

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

_Bool tcg_region_alloc__locked(TCGContext_conflict9 *s)

{
  size_t *psVar1;
  size_t sVar2;
  size_t sVar3;
  void *__s;
  void *pvVar4;
  
  sVar2 = (s->region).n;
  sVar3 = (s->region).current;
  if (sVar3 != sVar2) {
    pvVar4 = (void *)((s->region).stride * sVar3 + (long)(s->region).start_aligned);
    __s = pvVar4;
    if (sVar3 == 0) {
      __s = (s->region).start;
    }
    if (sVar2 - 1 == sVar3) {
      pvVar4 = (s->region).end;
    }
    else {
      pvVar4 = (void *)((long)pvVar4 + (s->region).size);
    }
    s->code_gen_buffer = __s;
    s->code_gen_ptr = __s;
    s->code_gen_buffer_size = (long)pvVar4 - (long)__s;
    memset(__s,0,(long)pvVar4 - (long)__s);
    s->code_gen_highwater = (void *)((long)pvVar4 + -0x400);
    psVar1 = &(s->region).current;
    *psVar1 = *psVar1 + 1;
  }
  return sVar3 == sVar2;
}

Assistant:

static bool tcg_region_alloc__locked(TCGContext *s)
{
    if (s->region.current == s->region.n) {
        return true;
    }
    tcg_region_assign(s, s->region.current);
    s->region.current++;
    return false;
}